

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void down2_symodd(uint8_t *input,int length,uint8_t *output)

{
  uint8_t uVar1;
  int iVar2;
  uint8_t *in_RDX;
  int in_ESI;
  long in_RDI;
  int sum_3;
  int sum_2;
  int sum_1;
  int sum;
  int l2;
  int l1;
  uint8_t *optr;
  int j;
  int i;
  int filter_len_half;
  int16_t *filter;
  int local_90;
  int local_7c;
  int local_70;
  int local_5c;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint8_t *local_38;
  int local_2c;
  int local_28;
  
  iVar2 = (in_ESI - 3U & 1) + (in_ESI - 3U);
  if (iVar2 < 4) {
    local_38 = in_RDX;
    for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 2) {
      local_44 = (uint)*(byte *)(in_RDI + local_28) * 0x40 + 0x40;
      for (local_2c = 1; local_2c < 4; local_2c = local_2c + 1) {
        if (local_28 - local_2c < 0) {
          local_5c = 0;
        }
        else {
          local_5c = local_28 - local_2c;
        }
        if (local_28 + local_2c < in_ESI) {
          local_70 = local_28 + local_2c;
        }
        else {
          local_70 = in_ESI + -1;
        }
        local_44 = ((uint)*(byte *)(in_RDI + local_5c) + (uint)*(byte *)(in_RDI + local_70)) *
                   (int)av1_down2_symodd_half_filter[local_2c] + local_44;
      }
      uVar1 = clip_pixel(local_44 >> 7);
      *local_38 = uVar1;
      local_38 = local_38 + 1;
    }
  }
  else {
    local_38 = in_RDX;
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 2) {
      local_48 = (uint)*(byte *)(in_RDI + local_28) * 0x40 + 0x40;
      for (local_2c = 1; local_2c < 4; local_2c = local_2c + 1) {
        if (local_28 - local_2c < 0) {
          local_7c = 0;
        }
        else {
          local_7c = local_28 - local_2c;
        }
        local_48 = ((uint)*(byte *)(in_RDI + local_7c) +
                   (uint)*(byte *)(in_RDI + (local_28 + local_2c))) *
                   (int)av1_down2_symodd_half_filter[local_2c] + local_48;
      }
      uVar1 = clip_pixel(local_48 >> 7);
      *local_38 = uVar1;
      local_38 = local_38 + 1;
    }
    for (; local_28 < iVar2; local_28 = local_28 + 2) {
      local_4c = (uint)*(byte *)(in_RDI + local_28) * 0x40 + 0x40;
      for (local_2c = 1; local_2c < 4; local_2c = local_2c + 1) {
        local_4c = ((uint)*(byte *)(in_RDI + (local_28 - local_2c)) +
                   (uint)*(byte *)(in_RDI + (local_28 + local_2c))) *
                   (int)av1_down2_symodd_half_filter[local_2c] + local_4c;
      }
      uVar1 = clip_pixel(local_4c >> 7);
      *local_38 = uVar1;
      local_38 = local_38 + 1;
    }
    for (; local_28 < in_ESI; local_28 = local_28 + 2) {
      local_50 = (uint)*(byte *)(in_RDI + local_28) * 0x40 + 0x40;
      for (local_2c = 1; local_2c < 4; local_2c = local_2c + 1) {
        if (local_28 + local_2c < in_ESI) {
          local_90 = local_28 + local_2c;
        }
        else {
          local_90 = in_ESI + -1;
        }
        local_50 = ((uint)*(byte *)(in_RDI + (local_28 - local_2c)) +
                   (uint)*(byte *)(in_RDI + local_90)) * (int)av1_down2_symodd_half_filter[local_2c]
                   + local_50;
      }
      uVar1 = clip_pixel(local_50 >> 7);
      *local_38 = uVar1;
      local_38 = local_38 + 1;
    }
  }
  return;
}

Assistant:

static void down2_symodd(const uint8_t *const input, int length,
                         uint8_t *output) {
  // Actual filter len = 2 * filter_len_half - 1.
  const int16_t *filter = av1_down2_symodd_half_filter;
  const int filter_len_half = sizeof(av1_down2_symodd_half_filter) / 2;
  int i, j;
  uint8_t *optr = output;
  int l1 = filter_len_half - 1;
  int l2 = (length - filter_len_half + 1);
  l1 += (l1 & 1);
  l2 += (l2 & 1);
  if (l1 > l2) {
    // Short input length.
    for (i = 0; i < length; i += 2) {
      int sum = (1 << (FILTER_BITS - 1)) + input[i] * filter[0];
      for (j = 1; j < filter_len_half; ++j) {
        sum += (input[(i - j < 0 ? 0 : i - j)] +
                input[(i + j >= length ? length - 1 : i + j)]) *
               filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
  } else {
    // Initial part.
    for (i = 0; i < l1; i += 2) {
      int sum = (1 << (FILTER_BITS - 1)) + input[i] * filter[0];
      for (j = 1; j < filter_len_half; ++j) {
        sum += (input[(i - j < 0 ? 0 : i - j)] + input[i + j]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
    // Middle part.
    for (; i < l2; i += 2) {
      int sum = (1 << (FILTER_BITS - 1)) + input[i] * filter[0];
      for (j = 1; j < filter_len_half; ++j) {
        sum += (input[i - j] + input[i + j]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
    // End part.
    for (; i < length; i += 2) {
      int sum = (1 << (FILTER_BITS - 1)) + input[i] * filter[0];
      for (j = 1; j < filter_len_half; ++j) {
        sum += (input[i - j] + input[(i + j >= length ? length - 1 : i + j)]) *
               filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
  }
}